

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writesrc.cpp
# Opt level: O3

void usrc_writeUCPTrieStruct
               (FILE *f,char *prefix,UCPTrie *pTrie,char *indexName,char *dataName,char *postfix)

{
  if (prefix != (char *)0x0) {
    fputs(prefix,(FILE *)f);
  }
  fprintf((FILE *)f,"    %s,\n    { %s },\n",indexName,dataName);
  fprintf((FILE *)f,
          "    %ld, %ld,\n    0x%lx, 0x%x,\n    %d, %d,\n    0, 0,\n    0x%x, 0x%lx,\n    0x%lx,\n",
          (long)pTrie->indexLength,(long)pTrie->dataLength,(long)pTrie->highStart,
          (ulong)pTrie->shifted12HighStart,(ulong)(uint)(int)pTrie->type,
          (ulong)(uint)(int)pTrie->valueWidth,(ulong)pTrie->index3NullOffset,
          (long)pTrie->dataNullOffset,(ulong)pTrie->nullValue);
  if (postfix != (char *)0x0) {
    fputs(postfix,(FILE *)f);
    return;
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
usrc_writeUCPTrieStruct(FILE *f,
                        const char *prefix,
                        const UCPTrie *pTrie,
                        const char *indexName, const char *dataName,
                        const char *postfix) {
    if(prefix!=NULL) {
        fputs(prefix, f);
    }
    fprintf(
        f,
        "    %s,\n"             // index
        "    { %s },\n",        // data (union)
        indexName,
        dataName);
    fprintf(
        f,
        "    %ld, %ld,\n"       // indexLength, dataLength
        "    0x%lx, 0x%x,\n"    // highStart, shifted12HighStart
        "    %d, %d,\n"         // type, valueWidth
        "    0, 0,\n"           // reserved32, reserved16
        "    0x%x, 0x%lx,\n"    // index3NullOffset, dataNullOffset
        "    0x%lx,\n",         // nullValue
        (long)pTrie->indexLength, (long)pTrie->dataLength,
        (long)pTrie->highStart, pTrie->shifted12HighStart,
        pTrie->type, pTrie->valueWidth,
        pTrie->index3NullOffset, (long)pTrie->dataNullOffset,
        (long)pTrie->nullValue);
    if(postfix!=NULL) {
        fputs(postfix, f);
    }
}